

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O3

void ihevc_inter_pred_chroma_vert_w16inp_w16out
               (WORD16 *pi2_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  long lVar1;
  short *psVar2;
  uint uVar3;
  short *psVar4;
  ulong uVar5;
  int iVar6;
  short *psVar7;
  ulong uVar8;
  long lVar9;
  
  if (0 < ht) {
    lVar1 = (long)src_strd;
    uVar5 = 1;
    if (1 < wd * 2) {
      uVar5 = (ulong)(uint)(wd * 2);
    }
    psVar4 = pi2_src + -lVar1;
    iVar6 = 0;
    do {
      if (0 < wd) {
        uVar8 = 0;
        psVar2 = psVar4;
        do {
          lVar9 = 0;
          uVar3 = 0;
          psVar7 = psVar2;
          do {
            uVar3 = uVar3 + (int)*psVar7 * (int)pi1_coeff[lVar9];
            lVar9 = lVar9 + 1;
            psVar7 = psVar7 + lVar1;
          } while (lVar9 != 4);
          pi2_dst[uVar8] = (WORD16)(uVar3 >> 6);
          uVar8 = uVar8 + 1;
          psVar2 = psVar2 + 1;
        } while (uVar8 != uVar5);
      }
      pi2_dst = pi2_dst + dst_strd;
      iVar6 = iVar6 + 1;
      psVar4 = psVar4 + lVar1;
    } while (iVar6 != ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_vert_w16inp_w16out(WORD16 *pi2_src,
                                                WORD16 *pi2_dst,
                                                WORD32 src_strd,
                                                WORD32 dst_strd,
                                                WORD8 *pi1_coeff,
                                                WORD32 ht,
                                                WORD32 wd)
{
    WORD32 row, col, i;
    WORD32 i4_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col++)
        {
            i4_tmp = 0;
            for(i = 0; i < NTAPS_CHROMA; i++)
            {
                i4_tmp += pi1_coeff[i] * pi2_src[col + (i - 1) * src_strd];
            }

            i4_tmp = (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH);

            pi2_dst[col] = i4_tmp;
        }

        pi2_src += src_strd;
        pi2_dst += dst_strd;
    }

}